

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O1

JDIMENSION get_word_gray_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  uint uVar1;
  JDIMENSION JVar2;
  FILE *pFVar3;
  jpeg_error_mgr *pjVar4;
  JSAMPROW pJVar5;
  ushort uVar6;
  _func_void_j_compress_ptr_cjpeg_source_ptr *p_Var7;
  long lVar8;
  
  pFVar3 = sinfo[1].input_file;
  uVar1 = *(uint *)&sinfo[1].buffer;
  p_Var7 = (_func_void_j_compress_ptr_cjpeg_source_ptr *)
           fread(sinfo[1].start_input,1,(size_t)sinfo[1].finish_input,(FILE *)sinfo->input_file);
  if (p_Var7 != sinfo[1].finish_input) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0x2b;
    (*pjVar4->error_exit)((j_common_ptr)cinfo);
  }
  JVar2 = cinfo->image_width;
  if (JVar2 != 0) {
    p_Var7 = sinfo[1].start_input;
    pJVar5 = *sinfo->buffer;
    lVar8 = 0;
    do {
      uVar6 = *(ushort *)(p_Var7 + lVar8 * 2) << 8 | *(ushort *)(p_Var7 + lVar8 * 2) >> 8;
      if (uVar1 < uVar6) {
        pjVar4 = cinfo->err;
        pjVar4->msg_code = 0x3f9;
        (*pjVar4->error_exit)((j_common_ptr)cinfo);
      }
      pJVar5[lVar8] = *(JSAMPLE *)((long)&pFVar3->_flags + (ulong)uVar6);
      lVar8 = lVar8 + 1;
    } while (JVar2 != (JDIMENSION)lVar8);
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_word_gray_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading raw-word-format PGM files with any maxval */
{
  ppm_source_ptr source = (ppm_source_ptr)sinfo;
  register JSAMPROW ptr;
  register U_CHAR *bufferptr;
  register JSAMPLE *rescale = source->rescale;
  JDIMENSION col;
  unsigned int maxval = source->maxval;

  if (!ReadOK(source->pub.input_file, source->iobuffer, source->buffer_width))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  ptr = source->pub.buffer[0];
  bufferptr = source->iobuffer;
  for (col = cinfo->image_width; col > 0; col--) {
    register unsigned int temp;
    temp  = UCH(*bufferptr++) << 8;
    temp |= UCH(*bufferptr++);
    if (temp > maxval)
      ERREXIT(cinfo, JERR_PPM_OUTOFRANGE);
    *ptr++ = rescale[temp];
  }
  return 1;
}